

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O2

void __thiscall
duckdb::WindowSegmentTreePart::FlushStates(WindowSegmentTreePart *this,bool combining)

{
  aggregate_update_t p_Var1;
  pointer pWVar2;
  reference pvVar3;
  AggregateInputData aggr_input_data;
  
  if (this->flush_count != 0) {
    aggr_input_data.bind_data.ptr = AggregateObject::GetFunctionData(this->aggr);
    aggr_input_data.allocator = this->allocator;
    aggr_input_data.combine_type = PRESERVE_INPUT;
    if (combining) {
      Vector::Verify(&this->statel,this->flush_count);
      (*(this->aggr->function).combine)
                (&this->statel,&this->statep,&aggr_input_data,this->flush_count);
    }
    else {
      pWVar2 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
               operator->(&this->cursor);
      DataChunk::Slice(&this->leaves,&pWVar2->chunk,&this->filter_sel,this->flush_count,0);
      p_Var1 = (this->aggr->function).update;
      pvVar3 = vector<duckdb::Vector,_true>::get<true>(&(this->leaves).data,0);
      (*p_Var1)(pvVar3,&aggr_input_data,
                ((long)(this->leaves).data.
                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->leaves).data.
                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x68,&this->statep,this->flush_count);
    }
    this->flush_count = 0;
  }
  return;
}

Assistant:

void WindowSegmentTreePart::FlushStates(bool combining) {
	if (!flush_count) {
		return;
	}

	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	if (combining) {
		statel.Verify(flush_count);
		aggr.function.combine(statel, statep, aggr_input_data, flush_count);
	} else {
		auto &scanned = cursor->chunk;
		leaves.Slice(scanned, filter_sel, flush_count);
		aggr.function.update(&leaves.data[0], aggr_input_data, leaves.ColumnCount(), statep, flush_count);
	}

	flush_count = 0;
}